

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint local_238;
  int is_nonce_valid;
  int local_230;
  uint local_22c;
  uchar *local_228;
  uchar *local_220;
  secp256k1_context *local_218;
  secp256k1_scalar *local_210;
  secp256k1_nonce_function local_208;
  secp256k1_modinv64_signed62 local_200;
  secp256k1_scalar local_1d8;
  uchar local_1b8 [40];
  secp256k1_scalar local_190;
  secp256k1_scalar local_170;
  secp256k1_ge r_1;
  uchar b [32];
  secp256k1_scalar local_d0;
  secp256k1_gej rp;
  
  local_238 = 0;
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  local_208 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    local_208 = noncefp;
  }
  local_228 = msg32;
  local_220 = seckey;
  local_22c = secp256k1_scalar_set_b32_seckey(&local_170,seckey);
  secp256k1_scalar_cmov(&local_170,&secp256k1_scalar_one,local_22c ^ 1);
  secp256k1_scalar_set_b32(&local_190,local_228,(int *)0x0);
  uVar12 = 0;
  local_218 = ctx;
  local_210 = r;
  while( true ) {
    iVar5 = (*local_208)(local_1b8,local_228,local_220,(uchar *)0x0,noncedata,uVar12);
    local_238 = (uint)(iVar5 != 0);
    if (iVar5 == 0) break;
    is_nonce_valid = secp256k1_scalar_set_b32_seckey(&local_1d8,local_1b8);
    secp256k1_declassify(ctx,&is_nonce_valid,4);
    if (is_nonce_valid != 0) {
      local_230 = 0;
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&rp,&local_1d8);
      secp256k1_ge_set_gej(&r_1,&rp);
      secp256k1_fe_impl_normalize(&r_1.x);
      secp256k1_fe_impl_normalize(&r_1.y);
      secp256k1_fe_impl_get_b32(b,&r_1.x);
      secp256k1_scalar_set_b32(r,b,&local_230);
      if (recid != (int *)0x0) {
        *recid = ((uint)r_1.y.n[0] & 1) + local_230 * 2;
      }
      secp256k1_scalar_mul(&local_d0,r,&local_170);
      secp256k1_scalar_add(&local_d0,&local_d0,&local_190);
      local_200.v[0] = local_1d8.d[0] & 0x3fffffffffffffff;
      local_200.v[1] = (local_1d8.d[1] & 0xfffffffffffffff) << 2 | local_1d8.d[0] >> 0x3e;
      local_200.v[2] = (local_1d8.d[2] & 0x3ffffffffffffff) << 4 | local_1d8.d[1] >> 0x3c;
      local_200.v[3] = (local_1d8.d[3] & 0xffffffffffffff) << 6 | local_1d8.d[2] >> 0x3a;
      local_200.v[4] = local_1d8.d[3] >> 0x38;
      secp256k1_modinv64(&local_200,&secp256k1_const_modinfo_scalar);
      secp256k1_scalar_from_signed62(s,&local_200);
      secp256k1_scalar_mul(s,s,&local_d0);
      secp256k1_gej_clear(&rp);
      secp256k1_ge_clear(&r_1);
      uVar6 = secp256k1_scalar_is_high(s);
      local_200.v[0] = CONCAT44(local_200.v[0]._4_4_,uVar6);
      uVar13 = -(long)(int)uVar6;
      iVar5 = secp256k1_scalar_is_zero(s);
      r = local_210;
      uVar9 = s->d[0] ^ uVar13;
      uVar10 = s->d[1] ^ uVar13;
      uVar11 = s->d[2] ^ uVar13;
      uVar1 = s->d[3];
      uVar2 = (ulong)CARRY8(uVar13 & 0xbfd25e8cd0364142,uVar9);
      uVar3 = (uVar13 & 0xbaaedce6af48a03b) + uVar10;
      uVar10 = (ulong)(CARRY8(uVar13 & 0xbaaedce6af48a03b,uVar10) || CARRY8(uVar3,uVar2));
      uVar4 = (uVar13 & 0xfffffffffffffffe) + uVar11;
      uVar8 = (ulong)(iVar5 + -1);
      s->d[0] = (uVar13 & 0xbfd25e8cd0364142) + uVar9 & uVar8;
      s->d[1] = uVar3 + uVar2 & uVar8;
      s->d[2] = uVar4 + uVar10 & uVar8;
      s->d[3] = ((uVar13 ^ uVar1) - (long)(int)uVar6) +
                (ulong)(CARRY8(uVar13 & 0xfffffffffffffffe,uVar11) || CARRY8(uVar4,uVar10)) & uVar8;
      if (recid != (int *)0x0) {
        *recid = *recid ^ uVar6;
      }
      uVar6 = secp256k1_scalar_is_zero(local_210);
      uVar7 = secp256k1_scalar_is_zero(s);
      ctx = local_218;
      local_238 = (uVar7 ^ 1) & ~uVar6;
      secp256k1_declassify(local_218,&local_238,4);
      uVar6 = local_238;
      if (local_238 != 0) goto LAB_00103cd9;
    }
    uVar12 = uVar12 + 1;
  }
  uVar6 = 0;
LAB_00103cd9:
  uVar6 = uVar6 & local_22c;
  uVar12 = uVar6 ^ 1;
  secp256k1_scalar_cmov(r,&secp256k1_scalar_zero,uVar12);
  secp256k1_scalar_cmov(s,&secp256k1_scalar_zero,uVar12);
  if (recid != (int *)0x0) {
    *recid = *recid & uVar12 - 1;
  }
  return uVar6;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}